

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply_randomizer_options.cpp
# Opt level: O1

void apply_randomizer_options(RandomizerOptions *options,RandomizerWorld *world)

{
  _Rb_tree_header *p_Var1;
  Item **ppIVar2;
  pointer *pppIVar3;
  vector<Item_*,_std::allocator<Item_*>_> *this;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
  *pmVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *ppVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ushort uVar7;
  pointer pbVar8;
  _Base_ptr p_Var9;
  pointer pbVar10;
  WorldNode *pWVar11;
  pointer ppWVar12;
  pointer ppIVar13;
  Item **ppIVar14;
  WorldNode *to_node;
  uint8_t i_2;
  bool bVar15;
  byte bVar16;
  int iVar17;
  string_type *psVar18;
  reference pbVar19;
  int *piVar20;
  long lVar21;
  mapped_type *ppIVar22;
  Item *pIVar23;
  reference pvVar24;
  ulong uVar25;
  string_type *psVar26;
  reference pbVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar28;
  WorldPath *pWVar29;
  mapped_type *ppWVar30;
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> _Var31;
  const_iterator cVar32;
  mapped_type *ppSVar33;
  SpawnLocation *spawn;
  _Base_ptr p_Var34;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar35;
  _Rb_tree_header *p_Var36;
  uint8_t i;
  uint uVar37;
  mapped_type pIVar38;
  uint8_t bit;
  uint8_t uVar39;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *ppVar40;
  undefined8 uVar41;
  pointer ppWVar42;
  pointer pFVar43;
  pointer ppIVar44;
  size_type sVar45;
  initializer_list<Flag> __l;
  initializer_list<Item_*> __l_00;
  vector<Flag,_std::allocator<Flag>_> flags_to_add;
  size_type __dnew_5;
  size_type __dnew;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings_to_empty;
  Json game_strings_json;
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  __begin1;
  key_type_conflict local_5f9;
  undefined1 local_5f8 [40];
  undefined1 local_5d0 [48];
  _Alloc_hider local_5a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_590;
  _Alloc_hider local_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_570;
  vector<Item_*,_std::allocator<Item_*>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  vector<Item_*,_std::allocator<Item_*>_> local_528;
  vector<WorldNode_*,_std::allocator<WorldNode_*>_> local_508;
  _Any_data local_4e8;
  code *local_4d8;
  undefined8 uStack_4d0;
  vector<WorldNode_*,_std::allocator<WorldNode_*>_> local_4c8;
  vector<Item_*,_std::allocator<Item_*>_> local_4a8;
  vector<Item_*,_std::allocator<Item_*>_> local_488;
  vector<Item_*,_std::allocator<Item_*>_> local_468;
  vector<WorldNode_*,_std::allocator<WorldNode_*>_> local_448;
  vector<Item_*,_std::allocator<Item_*>_> local_428;
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  _Alloc_hider local_3f0;
  undefined2 local_3e8;
  undefined1 local_3e6;
  undefined **local_3e0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  _Alloc_hider local_3c0;
  undefined2 local_3b8;
  undefined1 local_3b6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  undefined **local_3a0;
  undefined2 local_398;
  undefined1 local_396;
  undefined **local_390;
  undefined2 local_388;
  undefined1 local_386;
  undefined **local_380;
  undefined2 local_378;
  undefined1 local_376;
  undefined **local_370;
  undefined2 local_368;
  undefined1 local_366;
  undefined **local_360;
  undefined2 local_358;
  undefined1 local_356;
  undefined **local_350;
  undefined2 local_348;
  undefined1 local_346;
  undefined **local_340;
  undefined2 local_338;
  undefined1 local_336;
  undefined **local_330;
  undefined2 local_328;
  undefined1 local_326;
  undefined **local_320;
  undefined2 local_318;
  undefined1 local_316;
  undefined **local_310;
  undefined2 local_308;
  undefined1 local_306;
  undefined **local_300;
  undefined2 local_2f8;
  undefined1 local_2f6;
  undefined **local_2f0;
  undefined2 local_2e8;
  undefined1 local_2e6;
  undefined **local_2e0;
  undefined2 local_2d8;
  undefined1 local_2d6;
  undefined **local_2d0;
  undefined2 local_2c8;
  undefined1 local_2c6;
  undefined **local_2c0;
  undefined2 local_2b8;
  undefined1 local_2b6;
  undefined **local_2b0;
  undefined2 local_2a8;
  undefined1 local_2a6;
  undefined **local_2a0;
  undefined2 local_298;
  undefined1 local_296;
  undefined **local_290;
  undefined2 local_288;
  undefined1 local_286;
  undefined **local_280;
  undefined2 local_278;
  undefined1 local_276;
  undefined **local_270;
  undefined2 local_268;
  undefined1 local_266;
  undefined **local_260;
  undefined2 local_258;
  undefined1 local_256;
  undefined **local_250;
  undefined2 local_248;
  undefined1 local_246;
  undefined **local_240;
  undefined2 local_238;
  undefined1 local_236;
  undefined **local_230;
  undefined2 local_228;
  undefined1 local_226;
  undefined **local_220;
  undefined2 local_218;
  undefined1 local_216;
  undefined **local_210;
  undefined2 local_208;
  undefined1 local_206;
  undefined **local_200;
  undefined2 local_1f8;
  undefined1 local_1f6;
  undefined **local_1f0;
  undefined2 local_1e8;
  undefined1 local_1e6;
  undefined **local_1e0;
  undefined2 local_1d8;
  undefined1 local_1d6;
  undefined **local_1d0;
  undefined2 local_1c8;
  undefined1 local_1c6;
  undefined **local_1c0;
  undefined2 local_1b8;
  undefined1 local_1b6;
  undefined **local_1b0;
  undefined2 local_1a8;
  undefined1 local_1a6;
  undefined **local_1a0;
  undefined2 local_198;
  undefined1 local_196;
  undefined **local_190;
  undefined2 local_188;
  undefined1 local_186;
  undefined **local_180;
  undefined2 local_178;
  undefined1 local_176;
  undefined **local_170;
  undefined2 local_168;
  undefined1 local_166;
  undefined **local_160;
  undefined2 local_158;
  undefined1 local_156;
  undefined **local_150;
  undefined2 local_148;
  undefined1 local_146;
  undefined **local_140;
  undefined2 local_138;
  undefined1 local_136;
  undefined **local_130;
  undefined2 local_128;
  undefined1 local_126;
  undefined **local_120;
  undefined2 local_118;
  undefined1 local_116;
  undefined **local_110;
  undefined2 local_108;
  undefined1 local_106;
  undefined **local_100;
  undefined2 local_f8;
  undefined1 local_f6;
  undefined **local_f0;
  undefined2 local_e8;
  undefined1 local_e6;
  undefined **local_e0;
  undefined2 local_d8;
  undefined1 local_d6;
  undefined **local_d0;
  undefined2 local_c8;
  undefined1 local_c6;
  undefined **local_c0;
  undefined2 local_b8;
  undefined1 local_b6;
  undefined **local_b0;
  undefined2 local_a8;
  undefined1 local_a6;
  undefined **local_a0;
  undefined2 local_98;
  undefined1 local_96;
  undefined **local_90;
  undefined2 local_88;
  undefined1 local_86;
  undefined **local_80;
  undefined2 local_78;
  undefined1 local_76;
  undefined **local_70;
  undefined2 local_68;
  undefined1 local_66;
  undefined **local_60;
  undefined2 local_58;
  undefined1 local_56;
  undefined **local_50;
  undefined2 local_48;
  undefined1 local_46;
  undefined **local_40;
  undefined2 local_38;
  undefined1 local_36;
  
  (world->super_World)._starting_golds = options->_starting_gold;
  (world->super_World)._starting_life = options->_starting_life;
  local_410._0_8_ = &PTR_to_json_abi_cxx11__00261860;
  local_410._8_2_ = 0;
  local_410[10] = '\a';
  local_400._0_4_ = 0x261860;
  local_400._4_2_ = 0;
  local_400[6] = '\0';
  local_400[7] = '\0';
  local_400._8_2_ = 0;
  local_400[10] = 5;
  local_3f0._M_p = (pointer)&PTR_to_json_abi_cxx11__00261860;
  local_3e8 = 0;
  local_3e6 = 4;
  local_3e0[0] = &PTR_to_json_abi_cxx11__00261860;
  local_3e0[1]._0_2_ = 0;
  local_3e0[1]._2_1_ = '\0';
  local_3d0._M_allocated_capacity = (size_type)&PTR_to_json_abi_cxx11__00261860;
  local_3d0._8_2_ = 2;
  local_3d0._M_local_buf[10] = '\a';
  local_3c0._M_p = (pointer)&PTR_to_json_abi_cxx11__00261860;
  local_3b6 = 4;
  local_3b8 = 2;
  local_3b0._M_allocated_capacity = (size_type)&PTR_to_json_abi_cxx11__00261860;
  local_3b0._8_2_ = 2;
  local_3b0._M_local_buf[10] = '\x02';
  local_3a0 = &PTR_to_json_abi_cxx11__00261860;
  local_398 = 2;
  local_396 = 0;
  local_390 = &PTR_to_json_abi_cxx11__00261860;
  local_388 = 3;
  local_386 = 7;
  local_380 = &PTR_to_json_abi_cxx11__00261860;
  local_378 = 3;
  local_376 = 6;
  local_370 = &PTR_to_json_abi_cxx11__00261860;
  local_368 = 3;
  local_366 = 5;
  local_360 = &PTR_to_json_abi_cxx11__00261860;
  local_356 = 7;
  local_358 = 4;
  local_350 = &PTR_to_json_abi_cxx11__00261860;
  local_346 = 6;
  local_348 = 4;
  local_340 = &PTR_to_json_abi_cxx11__00261860;
  local_336 = 0;
  local_338 = 4;
  local_330 = &PTR_to_json_abi_cxx11__00261860;
  local_326 = 6;
  local_328 = 5;
  local_320 = &PTR_to_json_abi_cxx11__00261860;
  local_316 = 5;
  local_318 = 5;
  local_310 = &PTR_to_json_abi_cxx11__00261860;
  local_306 = 4;
  local_308 = 0x12;
  local_300 = &PTR_to_json_abi_cxx11__00261860;
  local_2f6 = 3;
  local_2f8 = 0x12;
  local_2f0 = &PTR_to_json_abi_cxx11__00261860;
  local_2e6 = 2;
  local_2e8 = 0x12;
  local_2e0 = &PTR_to_json_abi_cxx11__00261860;
  local_2d6 = 1;
  local_2d8 = 0x12;
  local_2d0 = &PTR_to_json_abi_cxx11__00261860;
  local_2c6 = 6;
  local_2c8 = 0x13;
  local_2c0 = &PTR_to_json_abi_cxx11__00261860;
  local_2b6 = 1;
  local_2b8 = 0x13;
  local_2b0 = &PTR_to_json_abi_cxx11__00261860;
  local_2a6 = 0;
  local_2a8 = 0x13;
  local_2a0 = &PTR_to_json_abi_cxx11__00261860;
  local_296 = 7;
  local_298 = 0x14;
  local_290 = &PTR_to_json_abi_cxx11__00261860;
  local_286 = 0;
  local_288 = 0x14;
  local_280 = &PTR_to_json_abi_cxx11__00261860;
  local_276 = 6;
  local_278 = 0x17;
  local_270 = &PTR_to_json_abi_cxx11__00261860;
  local_266 = 3;
  local_268 = 0x17;
  local_260 = &PTR_to_json_abi_cxx11__00261860;
  local_256 = 6;
  local_258 = 0x20;
  local_250 = &PTR_to_json_abi_cxx11__00261860;
  local_246 = 5;
  local_248 = 0x20;
  local_240 = &PTR_to_json_abi_cxx11__00261860;
  local_236 = 4;
  local_238 = 0x20;
  local_230 = &PTR_to_json_abi_cxx11__00261860;
  local_226 = 5;
  local_228 = 0x27;
  local_220 = &PTR_to_json_abi_cxx11__00261860;
  local_216 = 7;
  local_218 = 0x28;
  local_210 = &PTR_to_json_abi_cxx11__00261860;
  local_206 = 6;
  local_208 = 0x28;
  local_200 = &PTR_to_json_abi_cxx11__00261860;
  local_1f6 = 5;
  local_1f8 = 0x28;
  local_1f0 = &PTR_to_json_abi_cxx11__00261860;
  local_1e6 = 6;
  local_1e8 = 0x29;
  local_1e0 = &PTR_to_json_abi_cxx11__00261860;
  local_1d6 = 7;
  local_1d8 = 0x2a;
  local_1d0 = &PTR_to_json_abi_cxx11__00261860;
  local_1c6 = 0;
  local_1c8 = 0x2a;
  local_1c0 = &PTR_to_json_abi_cxx11__00261860;
  local_1b6 = 7;
  local_1b8 = 0x2b;
  local_1b0 = &PTR_to_json_abi_cxx11__00261860;
  local_1a6 = 1;
  local_1a8 = 0x2b;
  local_1a0 = &PTR_to_json_abi_cxx11__00261860;
  local_196 = 1;
  local_198 = 5;
  local_190 = &PTR_to_json_abi_cxx11__00261860;
  local_186 = 1;
  local_188 = 2;
  local_180 = &PTR_to_json_abi_cxx11__00261860;
  local_178 = 6;
  local_176 = 6;
  local_170 = &PTR_to_json_abi_cxx11__00261860;
  local_168 = 6;
  local_166 = 5;
  local_160 = &PTR_to_json_abi_cxx11__00261860;
  local_158 = 6;
  local_156 = 4;
  local_150 = &PTR_to_json_abi_cxx11__00261860;
  local_148 = 6;
  local_146 = 3;
  local_140 = &PTR_to_json_abi_cxx11__00261860;
  local_138 = 6;
  local_136 = 2;
  local_130 = &PTR_to_json_abi_cxx11__00261860;
  local_128 = 7;
  local_126 = 7;
  local_120 = &PTR_to_json_abi_cxx11__00261860;
  local_118 = 7;
  local_116 = 5;
  local_110 = &PTR_to_json_abi_cxx11__00261860;
  local_108 = 7;
  local_106 = 4;
  local_100 = &PTR_to_json_abi_cxx11__00261860;
  local_f8 = 7;
  local_f6 = 2;
  local_f0 = &PTR_to_json_abi_cxx11__00261860;
  local_e8 = 8;
  local_e6 = 7;
  local_e0 = &PTR_to_json_abi_cxx11__00261860;
  local_d8 = 8;
  local_d6 = 6;
  local_d0 = &PTR_to_json_abi_cxx11__00261860;
  local_c8 = 8;
  local_c6 = 5;
  local_c0 = &PTR_to_json_abi_cxx11__00261860;
  local_b8 = 8;
  local_b6 = 4;
  local_b0 = &PTR_to_json_abi_cxx11__00261860;
  local_a8 = 8;
  local_a6 = 3;
  local_a0 = &PTR_to_json_abi_cxx11__00261860;
  local_98 = 8;
  local_96 = 2;
  local_90 = &PTR_to_json_abi_cxx11__00261860;
  local_88 = 8;
  local_86 = 1;
  local_80 = &PTR_to_json_abi_cxx11__00261860;
  local_78 = 9;
  local_76 = 6;
  local_70 = &PTR_to_json_abi_cxx11__00261860;
  local_68 = 9;
  local_66 = 5;
  local_60 = &PTR_to_json_abi_cxx11__00261860;
  local_58 = 9;
  local_56 = 4;
  local_50 = &PTR_to_json_abi_cxx11__00261860;
  local_48 = 9;
  local_46 = 3;
  local_40 = &PTR_to_json_abi_cxx11__00261860;
  local_38 = 9;
  local_36 = 2;
  __l._M_len = 0x3e;
  __l._M_array = (iterator)local_410;
  std::vector<Flag,_std::allocator<Flag>_>::vector
            ((vector<Flag,_std::allocator<Flag>_> *)local_5d0,__l,(allocator_type *)local_5f8);
  if (options->_all_trees_visited_at_start == true) {
    uVar39 = '\0';
    do {
      local_410._0_8_ = &PTR_to_json_abi_cxx11__00261860;
      local_410[10] = uVar39;
      local_410._8_2_ = 0x23;
      std::vector<Flag,_std::allocator<Flag>_>::emplace_back<Flag>
                ((vector<Flag,_std::allocator<Flag>_> *)local_5d0,(Flag *)local_410);
      uVar39 = uVar39 + '\x01';
    } while (uVar39 != '\b');
    local_410._0_8_ = &PTR_to_json_abi_cxx11__00261860;
    local_410._8_2_ = 0x25;
    local_410[10] = '\0';
    std::vector<Flag,_std::allocator<Flag>_>::emplace_back<Flag>
              ((vector<Flag,_std::allocator<Flag>_> *)local_5d0,(Flag *)local_410);
    local_410._0_8_ = &PTR_to_json_abi_cxx11__00261860;
    local_410._8_2_ = 0x25;
    local_410[10] = '\x01';
    std::vector<Flag,_std::allocator<Flag>_>::emplace_back<Flag>
              ((vector<Flag,_std::allocator<Flag>_> *)local_5d0,(Flag *)local_410);
  }
  if (options->_remove_gumi_boulder == true) {
    local_410._0_8_ = &PTR_to_json_abi_cxx11__00261860;
    local_410._8_2_ = 2;
    local_410[10] = '\x06';
    std::vector<Flag,_std::allocator<Flag>_>::emplace_back<Flag>
              ((vector<Flag,_std::allocator<Flag>_> *)local_5d0,(Flag *)local_410);
  }
  std::vector<Flag,std::allocator<Flag>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Flag*,std::vector<Flag,std::allocator<Flag>>>>
            ((vector<Flag,std::allocator<Flag>> *)&(world->super_World)._starting_flags,
             (world->super_World)._starting_flags.super__Vector_base<Flag,_std::allocator<Flag>_>.
             _M_impl.super__Vector_impl_data._M_finish,local_5d0._0_8_,local_5d0._8_8_);
  if ((pointer)local_5d0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_5d0._0_8_,local_5d0._16_8_ - local_5d0._0_8_);
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::cbegin((const_iterator *)local_5d0,&options->_model_patch_items);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::iteration_proxy_value
            ((iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_410,(const_iterator *)local_5d0);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::cend((const_iterator *)local_5f8,&options->_model_patch_items);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::iteration_proxy_value
            ((iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_5d0,(const_iterator *)local_5f8);
  p_Var1 = &(world->super_World)._items._M_t._M_impl.super__Rb_tree_header;
  while (bVar15 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            ((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_410,
                             (iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_5d0), !bVar15) {
    psVar18 = nlohmann::detail::
              iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::key((iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     *)local_410);
    pbVar19 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)local_410);
    pbVar8 = (pointer)(psVar18->_M_dataplus)._M_p;
    piVar20 = __errno_location();
    iVar17 = *piVar20;
    *piVar20 = 0;
    lVar21 = strtol((char *)pbVar8,(char **)local_5f8,10);
    if ((pointer)local_5f8._0_8_ == pbVar8) {
      std::__throw_invalid_argument("stoi");
LAB_0017f83d:
      std::__throw_out_of_range("stoi");
    }
    if ((lVar21 - 0x80000000U < 0xffffffff00000000) || (*piVar20 == 0x22)) goto LAB_0017f83d;
    if (*piVar20 == 0) {
      *piVar20 = iVar17;
    }
    bVar16 = (byte)lVar21;
    p_Var9 = (world->super_World)._items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var34 = &p_Var1->_M_header;
    for (; (_Rb_tree_header *)p_Var9 != (_Rb_tree_header *)0x0; p_Var9 = (&p_Var9->_M_left)[bVar15])
    {
      bVar15 = (byte)*(size_t *)(p_Var9 + 1) < bVar16;
      if (!bVar15) {
        p_Var34 = p_Var9;
      }
    }
    p_Var36 = p_Var1;
    if (((_Rb_tree_header *)p_Var34 != p_Var1) &&
       (p_Var36 = (_Rb_tree_header *)p_Var34,
       bVar16 < (byte)((_Rb_tree_header *)p_Var34)->_M_node_count)) {
      p_Var36 = p_Var1;
    }
    if (p_Var36 == p_Var1) {
      pIVar23 = Item::from_json(bVar16,pbVar19);
      World::add_item(&world->super_World,pIVar23);
    }
    else {
      local_5f8[0] = bVar16;
      ppIVar22 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_5f8);
      Item::apply_json(*ppIVar22,pbVar19);
    }
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_410);
    local_3f0._M_p = local_3f0._M_p + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_p != &local_3b0) {
    operator_delete(local_3c0._M_p,local_3b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0[0] != &local_3d0) {
    operator_delete(local_3e0[0],local_3d0._M_allocated_capacity + 1);
  }
  if (options->_jewel_count < 6) {
    if (options->_jewel_count == 5) {
      local_410[0] = 0x22;
      ppIVar22 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      local_400._0_4_ = 0x6c6c6559;
      local_400._4_2_ = 0x776f;
      local_400[6] = ' ';
      local_400[7] = 'J';
      local_400._8_2_ = 0x7765;
      local_400[10] = 0x65;
      local_400[0xb] = 0x6c;
      local_410._8_2_ = 0xc;
      local_410[10] = '\0';
      local_410._11_5_ = 0;
      local_400[0xc] = 0;
      local_410._0_8_ = (pointer)local_400;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&(*ppIVar22)->_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
      if ((pointer)local_410._0_8_ != (pointer)local_400) {
        operator_delete((void *)local_410._0_8_,
                        CONCAT17(local_400[7],
                                 CONCAT16(local_400[6],CONCAT24(local_400._4_2_,local_400._0_4_))) +
                        1);
      }
      local_410[0] = '\"';
      ppIVar22 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      (**(*ppIVar22)->_vptr_Item)(*ppIVar22,500);
      local_410[0] = 0x21;
      ppIVar22 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      (*ppIVar22)->_max_quantity = '\x01';
    }
    if (3 < options->_jewel_count) {
      local_410[0] = 0x21;
      ppIVar22 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      local_400._0_4_ = 0x65756c42;
      local_400._4_2_ = 0x4a20;
      local_400[6] = 'e';
      local_400[7] = 'w';
      local_400._8_2_ = 0x6c65;
      local_410._8_2_ = 10;
      local_410[10] = '\0';
      local_410._11_5_ = 0;
      local_400[10] = 0;
      local_410._0_8_ = (pointer)local_400;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&(*ppIVar22)->_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
      if ((pointer)local_410._0_8_ != (pointer)local_400) {
        operator_delete((void *)local_410._0_8_,
                        CONCAT17(local_400[7],
                                 CONCAT16(local_400[6],CONCAT24(local_400._4_2_,local_400._0_4_))) +
                        1);
      }
      local_410[0] = '!';
      ppIVar22 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      (**(*ppIVar22)->_vptr_Item)(*ppIVar22,500);
      local_410[0] = 0x21;
      ppIVar22 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      (*ppIVar22)->_max_quantity = '\x01';
    }
    if (2 < options->_jewel_count) {
      local_410[0] = 0x34;
      ppIVar22 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      local_400._0_4_ = 0x65657247;
      local_400._4_2_ = 0x206e;
      local_400[6] = 'J';
      local_400[7] = 'e';
      local_400._8_2_ = 0x6577;
      local_400[10] = 0x6c;
      local_410._8_2_ = 0xb;
      local_410[10] = '\0';
      local_410._11_5_ = 0;
      local_400[0xb] = 0;
      local_410._0_8_ = (pointer)local_400;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&(*ppIVar22)->_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
      if ((pointer)local_410._0_8_ != (pointer)local_400) {
        operator_delete((void *)local_410._0_8_,
                        CONCAT17(local_400[7],
                                 CONCAT16(local_400[6],CONCAT24(local_400._4_2_,local_400._0_4_))) +
                        1);
      }
      local_410[0] = '4';
      ppIVar22 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      (**(*ppIVar22)->_vptr_Item)(*ppIVar22,500);
      local_410[0] = 0x34;
      ppIVar22 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      pIVar38 = *ppIVar22;
      uVar39 = '\x01';
      goto LAB_0017df86;
    }
  }
  else {
    local_410[0] = 0x28;
    ppIVar22 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    pIVar38 = *ppIVar22;
    local_400._0_4_ = 0x617a614b;
    local_400._4_2_ = 0x746c;
    local_400[6] = ' ';
    local_400[7] = 'J';
    local_400._8_2_ = 0x7765;
    local_400[10] = 0x65;
    local_400[0xb] = 0x6c;
    local_410._8_2_ = 0xc;
    local_410[10] = '\0';
    local_410._11_5_ = 0;
    local_400[0xc] = 0;
    local_410._0_8_ = (pointer)local_400;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&pIVar38->_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
    if ((pointer)local_410._0_8_ != (pointer)local_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(local_400[7],
                               CONCAT16(local_400[6],CONCAT24(local_400._4_2_,local_400._0_4_))) + 1
                     );
    }
    uVar39 = options->_jewel_count;
LAB_0017df86:
    pIVar38->_max_quantity = uVar39;
  }
  lVar21 = 0;
  do {
    local_5f9 = (key_type_conflict)lVar21;
    ppIVar22 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,&local_5f9);
    bVar16 = (options->_starting_items)._M_elems[lVar21];
    if (8 < bVar16) {
      bVar16 = 9;
    }
    (*ppIVar22)->_starting_quantity = bVar16;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x3e);
  if (options->_use_armor_upgrades != false) {
    local_410[0] = '\t';
    ppIVar22 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    (**(*ppIVar22)->_vptr_Item)(*ppIVar22,0xfa);
    local_410[0] = '\n';
    ppIVar22 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    (**(*ppIVar22)->_vptr_Item)(*ppIVar22,0xfa);
    local_410[0] = '\v';
    ppIVar22 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    (**(*ppIVar22)->_vptr_Item)(*ppIVar22,0xfa);
    local_410[0] = 0xc;
    ppIVar22 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    (**(*ppIVar22)->_vptr_Item)(*ppIVar22,0xfa);
  }
  if (options->_consumable_record_book == true) {
    local_410[0] = '#';
    ppIVar22 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    (*ppIVar22)->_max_quantity = '\t';
    local_410[0] = '#';
    ppIVar22 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    uVar7 = (*ppIVar22)->_gold_value;
    local_410[0] = 0x23;
    ppIVar22 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    (**(*ppIVar22)->_vptr_Item)(*ppIVar22,(ulong)(uVar7 / 5));
  }
  if (options->_consumable_spell_book == true) {
    local_410[0] = '$';
    ppIVar22 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    (*ppIVar22)->_max_quantity = '\t';
    local_410[0] = '$';
    ppIVar22 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    uVar7 = (*ppIVar22)->_gold_value;
    local_410[0] = 0x24;
    ppIVar22 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    (**(*ppIVar22)->_vptr_Item)(*ppIVar22,(ulong)(uVar7 / 5));
  }
  local_4e8._M_unused._M_object = (void *)0x0;
  local_4e8._8_8_ = 0;
  local_4d8 = (code *)0x0;
  uStack_4d0 = 0;
  nlohmann::
  basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<unsigned_char_const(&)[15116]>
            ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_508,
             (uchar (*) [15116])
             "{\n    \"emptiedIndices\": [\n        // Debug menu strings\n        \"1d\", \"1e\", \"1f\", \"20\",\n        \"23\", \"24\", \"25\", \"26\", \"27\", \"28\", \"29\", \"2a\", \"2b\", \"2c\", \"2d\", \"2e\", \"2f\", \n              \"30\", \"31\", \"32\", \"33\", \"34\", \"35\", \"36\", \"37\", \"38\", \"39\", \"3a\", \"3b\", \n              \"3c\", \"3d\", \"3e\", \"3f\", \"40\", \"41\", \"42\", \"43\", \"44\", \"45\", \"46\", \"47\", \n              \"48\", \"49\", \"4a\", \"4b\", \"4c\", \"4d\", \n        // Unreachable Massan elder dialogues\n        \"148\", \"149\",\n        // Unreachable Fara dialogues\n        \"14f\", \"150\",\n        // Pockets boulder dialogue\n        \"180\", \"181\", \"182\", \"183\", \"184\", \"185\", \"186\", \"187\", \"188\", \"189\", \"18a\", \"18b\", \n        \"18c\", \"18d\",\n        // Unreachable Prospero dialogues\n        \"1c6\", \"1c7\", \"1c8\", \"1c9\", \"1ca\", \"1cb\", \"1cc\", \"1cd\", \"1ce\", \"1cf\", \"1d0\", \"1d1\",\n               \"1d2\", \"1d3\", \"1d4\", \"1d5\", \"1d6\", \"1d7\", \"1d8\", \"1d9\",\n        // Arthur gift cutscene\n        \"497\", \"498\", \"499\", \"49a\", \"49b\",\n        // Fara discovering Nigel fallen from waterfall cutscene\n        \"52e\", \"52f\", \"530\", \"531\", \"532\", \"533\", \"534\",\n        // Cutscene spying on Gumi ritual\n        \"54d\", \"54e\", \"54f\", \"550\", \"551\",\n        // Kayla raft cutscene\n        \"572\", \"573\", \"574\", \"575\", \"576\", \"577\", \"578\", \n        // Lithograph cutscene\n        \"579\", \"57a\", \"57b\", \"57c\", \"57d\", \"57e\", \"57f\", \"580\", \"581\", \"582\", \"583\", \"584\", \"585\", \n               \"586\", \"587\", \"588\", \"589\", \"58a\", \"58b\", \"58c\", \"58d\", \"58e\", \"58f\", \"590\", \"591\", \n               \"592\", \n        // Mercator gate guards\n        \"5a0\", \"5a1\", \"5a2\", \"5a3\", \"5a4\", \"5a5\", \"5a6\", \"5a7\", \"5a8\", \"5a9\",\n        // Fahl intermediary dialogues\n        \"5b6\", \"5b7\", \"5b8\", \"5b9\", \"5ba\", \"5bb\", \"5bc\", \"5bd\", \"5be\", \"5bf\", \"5c0\", \"5c1\", \n               \"5c2\", \"5c3\",\n        // Mercator castle backdoor cutscene\n        \"5e1\", \"5e2\", \"5e3\", \"5e4\", \"5e5\", \"5e6\", \"5e7\", \"5e8\", \"5e9\", \"5ea\", \"5eb\", \"5ec\", \"5ed\", \n        // Mercator cutscenes (Madame Yard & castle)\n        \"5f6\", \"5f7\", \"5f8\", \"5f9\", \"5fa\", \"5fb\", \"5fc\", \"5fd\", \"5fe\",..." /* TRUNCATED STRING LITERAL */
             ,(parser_callback_t *)&local_4e8,true,true);
  if (local_4d8 != (code *)0x0) {
    (*local_4d8)(&local_4e8,&local_4e8,3);
  }
  local_400._0_4_ = 0x74706d65;
  local_400._4_2_ = 0x6569;
  local_400[6] = 'd';
  local_400[7] = 'I';
  local_400._8_2_ = 0x646e;
  local_400[10] = 0x69;
  local_400[0xb] = 99;
  local_400[0xc] = 0x65;
  local_400[0xd] = 0x73;
  local_410._8_8_ =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *)0xe;
  local_400[0xe] = 0;
  local_410._0_8_ = (pointer)local_400;
  pvVar24 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::at((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&local_508,(key_type *)local_410);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  get_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            (&local_528,pvVar24);
  if ((pointer)local_410._0_8_ != (pointer)local_400) {
    operator_delete((void *)local_410._0_8_,
                    CONCAT17(local_400[7],
                             CONCAT16(local_400[6],CONCAT24(local_400._4_2_,local_400._0_4_))) + 1);
  }
  ppIVar13 = local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppIVar44 = local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar20 = __errno_location();
    do {
      pIVar23 = *ppIVar44;
      iVar17 = *piVar20;
      *piVar20 = 0;
      lVar21 = strtol((char *)pIVar23,(char **)local_410,0x10);
      if ((Item *)local_410._0_8_ == pIVar23) {
        std::__throw_invalid_argument("stoi");
LAB_0017f86d:
        std::__throw_out_of_range("stoi");
      }
      if ((lVar21 - 0x80000000U < 0xffffffff00000000) || (*piVar20 == 0x22)) goto LAB_0017f86d;
      if (*piVar20 == 0) {
        *piVar20 = iVar17;
      }
      pbVar10 = (world->super_World)._game_strings.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar25 = (ulong)(((uint)lVar21 & 0xffff) << 5);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pbVar10->_M_dataplus)._M_p + uVar25),0,
                 *(size_type *)((long)&pbVar10->_M_string_length + uVar25),"",0);
      ppIVar44 = ppIVar44 + 4;
    } while (ppIVar44 != ppIVar13);
  }
  local_400._0_4_ = 0x63746170;
  local_400._4_2_ = 0x6568;
  local_400[6] = 's';
  local_410._8_8_ =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *)0x7;
  local_400[7] = '\0';
  local_410._0_8_ = (pointer)local_400;
  pvVar24 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::at((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&local_508,(key_type *)local_410);
  if ((pointer)local_410._0_8_ != (pointer)local_400) {
    operator_delete((void *)local_410._0_8_,
                    CONCAT17(local_400[7],
                             CONCAT16(local_400[6],CONCAT24(local_400._4_2_,local_400._0_4_))) + 1);
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin((iterator *)local_5d0,pvVar24);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::iteration_proxy_value
            ((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_410,(iterator *)local_5d0);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::end((iterator *)local_5f8,pvVar24);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::iteration_proxy_value
            ((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_5d0,
             (iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_5f8);
  while( true ) {
    bVar15 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)local_410,
                        (iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)local_5d0);
    if (bVar15) break;
    psVar26 = nlohmann::detail::
              iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::key((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     *)local_410);
    pbVar27 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)local_410);
    pbVar8 = (pointer)(psVar26->_M_dataplus)._M_p;
    piVar20 = __errno_location();
    iVar17 = *piVar20;
    *piVar20 = 0;
    lVar21 = strtol((char *)pbVar8,(char **)local_5f8,0x10);
    if ((pointer)local_5f8._0_8_ == pbVar8) {
      std::__throw_invalid_argument("stoi");
LAB_0017f855:
      std::__throw_out_of_range("stoi");
    }
    if ((lVar21 - 0x80000000U < 0xffffffff00000000) || (*piVar20 == 0x22)) goto LAB_0017f855;
    if (*piVar20 == 0) {
      *piVar20 = iVar17;
    }
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8,
               pbVar27);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(((world->super_World)._game_strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
               (ulong)(((uint)lVar21 & 0xffff) << 5)),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8);
    if ((pointer)local_5f8._0_8_ != (pointer)(local_5f8 + 0x10)) {
      operator_delete((void *)local_5f8._0_8_,(ulong)(local_5f8._16_8_ + 1));
    }
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_410);
    local_3f0._M_p = local_3f0._M_p + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_p != &local_3b0) {
    operator_delete(local_3c0._M_p,local_3b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0[0] != &local_3d0) {
    operator_delete(local_3e0[0],local_3d0._M_allocated_capacity + 1);
  }
  local_5f8._0_8_ = local_5f8 + 0x10;
  local_548._M_dataplus._M_p = (pointer)0x18;
  local_5f8._0_8_ =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8,
                  (size_type *)&local_548,0);
  paVar6 = &local_548.field_2;
  local_5f8._16_8_ = local_548._M_dataplus._M_p;
  ((HintSource *)local_5f8._0_8_)->_vptr_HintSource = (_func_int **)0x65687420796c6e4f;
  (((HintSource *)local_5f8._0_8_)->_text_ids).
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x7372657261656220;
  (((HintSource *)local_5f8._0_8_)->_text_ids).
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x2065687420666f20;
  local_5f8._8_8_ = local_548._M_dataplus._M_p;
  *((long)&((HintSource *)local_5f8._0_8_)->_vptr_HintSource + local_548._M_dataplus._M_p) = '\0';
  bVar16 = options->_jewel_count;
  sVar45 = 1;
  if (9 < bVar16) {
    sVar45 = (size_type)(3 - (bVar16 < 100));
  }
  local_548._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_548,sVar45,'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_548._M_dataplus._M_p,(uint)sVar45,(uint)bVar16);
  ppVar5 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5f8._8_8_)->_M_dataplus)._M_p + local_548._M_string_length);
  ppVar40 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)0xf;
  if ((HintSource *)local_5f8._0_8_ != (HintSource *)(local_5f8 + 0x10)) {
    ppVar40 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)local_5f8._16_8_;
  }
  if (ppVar40 < ppVar5) {
    uVar41 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._M_dataplus._M_p != paVar6) {
      uVar41 = local_548.field_2._M_allocated_capacity;
    }
    if (ppVar5 <= (ulong)uVar41) {
      pbVar28 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace(&local_548,0,0,(char *)local_5f8._0_8_,local_5f8._8_8_);
      goto LAB_0017e62b;
    }
  }
  pbVar28 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8
                      ,local_548._M_dataplus._M_p,local_548._M_string_length);
LAB_0017e62b:
  local_5d0._0_8_ = (pbVar28->_M_dataplus)._M_p;
  paVar35 = &pbVar28->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._0_8_ == paVar35) {
    local_5d0._16_8_ = paVar35->_M_allocated_capacity;
    local_5d0._24_8_ = *(size_type *)((long)&pbVar28->field_2 + 8);
    local_5d0._0_8_ = (pointer)(local_5d0 + 0x10);
  }
  else {
    local_5d0._16_8_ = paVar35->_M_allocated_capacity;
  }
  local_5d0._8_8_ = pbVar28->_M_string_length;
  (pbVar28->_M_dataplus)._M_p = (pointer)paVar35;
  pbVar28->_M_string_length = 0;
  paVar35->_M_local_buf[0] = '\0';
  pbVar28 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5d0," jewels\n are worthy of entering\n King Nole\'s domain...\x1e");
  local_410._0_8_ = (pbVar28->_M_dataplus)._M_p;
  paVar35 = &pbVar28->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._0_8_ == paVar35) {
    sVar45 = paVar35->_M_allocated_capacity;
    uVar41 = *(undefined8 *)((long)&pbVar28->field_2 + 8);
    local_400._0_4_ = (undefined4)sVar45;
    local_400._4_2_ = (undefined2)(sVar45 >> 0x20);
    local_400[6] = (undefined1)(sVar45 >> 0x30);
    local_400[7] = (undefined1)(sVar45 >> 0x38);
    local_400._8_2_ = (undefined2)uVar41;
    local_400[10] = (undefined1)((ulong)uVar41 >> 0x10);
    local_400[0xb] = (undefined1)((ulong)uVar41 >> 0x18);
    local_400[0xc] = (undefined1)((ulong)uVar41 >> 0x20);
    local_400[0xd] = (undefined1)((ulong)uVar41 >> 0x28);
    local_400[0xe] = (undefined1)((ulong)uVar41 >> 0x30);
    local_400[0xf] = (undefined1)((ulong)uVar41 >> 0x38);
    local_410._0_8_ = (mapped_type)local_400;
  }
  else {
    sVar45 = paVar35->_M_allocated_capacity;
    local_400._0_4_ = (undefined4)sVar45;
    local_400._4_2_ = (undefined2)(sVar45 >> 0x20);
    local_400[6] = (undefined1)(sVar45 >> 0x30);
    local_400[7] = (undefined1)(sVar45 >> 0x38);
  }
  local_410._8_8_ = pbVar28->_M_string_length;
  (pbVar28->_M_dataplus)._M_p = (pointer)paVar35;
  pbVar28->_M_string_length = 0;
  (pbVar28->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((world->super_World)._game_strings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x22,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
  if ((mapped_type)local_410._0_8_ != (mapped_type)local_400) {
    operator_delete((void *)local_410._0_8_,
                    CONCAT17(local_400[7],
                             CONCAT16(local_400[6],CONCAT24(local_400._4_2_,local_400._0_4_))) + 1);
  }
  if ((pointer)local_5d0._0_8_ != (pointer)(local_5d0 + 0x10)) {
    operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != paVar6) {
    operator_delete(local_548._M_dataplus._M_p,(ulong)(local_548.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((HintSource *)local_5f8._0_8_ != (HintSource *)(local_5f8 + 0x10)) {
    operator_delete((void *)local_5f8._0_8_,(ulong)(local_5f8._16_8_ + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_528);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&local_508);
  if (options->_remove_gumi_boulder == true) {
    pWVar29 = (WorldPath *)operator_new(0x60);
    local_5d0._0_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x10;
    local_410._0_8_ = (mapped_type)local_400;
    local_410._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
                    (size_type *)local_5d0,0);
    local_400._0_4_ = (undefined4)local_5d0._0_8_;
    local_400._4_2_ = SUB82(local_5d0._0_8_,4);
    local_400[6] = SUB81(local_5d0._0_8_,6);
    local_400[7] = SUB81(local_5d0._0_8_,7);
    ((mapped_type)local_410._0_8_)->_vptr_Item = (_func_int **)0x75675f6574756f72;
    ((mapped_type)local_410._0_8_)->_id = 'm';
    ((mapped_type)local_410._0_8_)->field_0x9 = 'i';
    ((mapped_type)local_410._0_8_)->field_0xa = '_';
    ((mapped_type)local_410._0_8_)->field_0xb = 'r';
    ((mapped_type)local_410._0_8_)->field_0xc = 'y';
    ((mapped_type)local_410._0_8_)->field_0xd = 'u';
    ((mapped_type)local_410._0_8_)->field_0xe = 'm';
    ((mapped_type)local_410._0_8_)->field_0xf = 'a';
    local_410._8_8_ = local_5d0._0_8_;
    *(char *)((long)&((mapped_type)local_410._0_8_)->_vptr_Item + local_5d0._0_8_) = '\0';
    ppWVar30 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(&world->_nodes,(key_type *)local_410);
    pWVar11 = *ppWVar30;
    local_5d0._0_8_ = local_5d0 + 0x10;
    local_5d0._8_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x4;
    local_5d0._16_5_ = 0x696d7567;
    ppWVar30 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(&world->_nodes,(key_type *)local_5d0);
    local_5f8._16_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x0;
    local_5f8._0_8_ = (HintSource *)0x0;
    local_5f8._8_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x0;
    local_4e8._M_unused._M_object = (void *)0x0;
    local_4e8._8_8_ = 0;
    local_4d8 = (code *)0x0;
    local_548._M_dataplus._M_p = (pointer)0x0;
    local_548._M_string_length = 0;
    local_548.field_2._M_allocated_capacity = 0;
    WorldPath::WorldPath
              (pWVar29,pWVar11,*ppWVar30,1,(vector<Item_*,_std::allocator<Item_*>_> *)local_5f8,
               (vector<WorldNode_*,_std::allocator<WorldNode_*>_> *)&local_4e8,
               (vector<Item_*,_std::allocator<Item_*>_> *)&local_548);
    RandomizerWorld::add_path(world,pWVar29);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_548._M_dataplus._M_p,
                      local_548.field_2._M_allocated_capacity - (long)local_548._M_dataplus._M_p);
    }
    if (local_4e8._M_unused._M_object != (void *)0x0) {
      operator_delete(local_4e8._M_unused._M_object,(long)local_4d8 - local_4e8._0_8_);
    }
    if ((HintSource *)local_5f8._0_8_ != (HintSource *)0x0) {
      operator_delete((void *)local_5f8._0_8_,local_5f8._16_8_ - local_5f8._0_8_);
    }
    if ((pointer)local_5d0._0_8_ != (pointer)(local_5d0 + 0x10)) {
      operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
    }
    if ((mapped_type)local_410._0_8_ != (mapped_type)local_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(local_400[7],
                               CONCAT16(local_400[6],CONCAT24(local_400._4_2_,local_400._0_4_))) + 1
                     );
    }
  }
  if (options->_enemy_jumping_in_logic == true) {
    pWVar29 = (WorldPath *)operator_new(0x60);
    local_5d0._0_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x11;
    local_410._0_8_ = (pointer)local_400;
    local_410._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
                    (size_type *)local_5d0,0);
    local_400._0_4_ = (undefined4)local_5d0._0_8_;
    local_400._4_2_ = SUB82(local_5d0._0_8_,4);
    local_400[6] = SUB81(local_5d0._0_8_,6);
    local_400[7] = SUB81(local_5d0._0_8_,7);
    ((pointer)local_410._0_8_)->m_type = 'r';
    ((pointer)local_410._0_8_)->field_0x1 = 'o';
    ((pointer)local_410._0_8_)->field_0x2 = 'u';
    ((pointer)local_410._0_8_)->field_0x3 = 't';
    ((pointer)local_410._0_8_)->field_0x4 = 'e';
    ((pointer)local_410._0_8_)->field_0x5 = '_';
    ((pointer)local_410._0_8_)->field_0x6 = 'l';
    ((pointer)local_410._0_8_)->field_0x7 = 'a';
    ((pointer)local_410._0_8_)->m_value = (json_value)0x6e697268735f656b;
    ((pointer)(local_410._0_8_ + 0x10))->m_type = 0x65;
    local_410._8_8_ = local_5d0._0_8_;
    (&((pointer)local_410._0_8_)->m_type)[local_5d0._0_8_] = null;
    pmVar4 = &world->_nodes;
    ppWVar30 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar4,(key_type *)local_410);
    pWVar11 = *ppWVar30;
    local_5d0._0_8_ = local_5d0 + 0x10;
    local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x17;
    local_5d0._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0,
                    (size_type *)&local_528,0);
    local_5d0._16_8_ =
         local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    ((pointer)local_5d0._0_8_)->_vptr_Flag = (_func_int **)0x616c5f6574756f72;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->byte = 0x6e697268735f656b;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->field_0xf = 0x6666696c635f656e;
    local_5d0._8_8_ =
         local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(char *)((long)&((pointer)local_5d0._0_8_)->_vptr_Flag +
             (long)local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                   super__Vector_impl_data._M_start) = '\0';
    ppWVar30 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar4,(key_type *)local_5d0);
    local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_508.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_508.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_508.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_428.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_428.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_428.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    WorldPath::WorldPath(pWVar29,pWVar11,*ppWVar30,1,&local_528,&local_508,&local_428);
    RandomizerWorld::add_path(world,pWVar29);
    pFVar43 = (pointer)(local_5d0 + 0x10);
    if (local_428.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_428.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_428.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_428.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_508.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_508.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_508.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_508.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pointer)local_5d0._0_8_ != pFVar43) {
      operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
    }
    if ((pointer)local_410._0_8_ != (pointer)local_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(local_400[7],
                               CONCAT16(local_400[6],CONCAT24(local_400._4_2_,local_400._0_4_))) + 1
                     );
    }
    local_5d0._0_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x10;
    local_410._0_8_ = (pointer)local_400;
    local_410._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
                    (size_type *)local_5d0,0);
    local_400._0_4_ = (undefined4)local_5d0._0_8_;
    local_400._4_2_ = SUB82(local_5d0._0_8_,4);
    local_400[6] = SUB81(local_5d0._0_8_,6);
    local_400[7] = SUB81(local_5d0._0_8_,7);
    ((mapped_type)local_410._0_8_)->_vptr_Item = (_func_int **)0x65776f745f72696d;
    ((mapped_type)local_410._0_8_)->_id = 'r';
    ((mapped_type)local_410._0_8_)->field_0x9 = '_';
    ((mapped_type)local_410._0_8_)->field_0xa = 's';
    ((mapped_type)local_410._0_8_)->field_0xb = 'e';
    ((mapped_type)local_410._0_8_)->field_0xc = 'c';
    ((mapped_type)local_410._0_8_)->field_0xd = 't';
    ((mapped_type)local_410._0_8_)->field_0xe = 'o';
    ((mapped_type)local_410._0_8_)->field_0xf = 'r';
    local_410._8_8_ = local_5d0._0_8_;
    *(char *)((long)&((mapped_type)local_410._0_8_)->_vptr_Item + local_5d0._0_8_) = '\0';
    ppWVar30 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar4,(key_type *)local_410);
    pWVar11 = *ppWVar30;
    local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x1b;
    local_5d0._0_8_ = pFVar43;
    local_5d0._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0,
                    (size_type *)&local_560,0);
    local_5d0._16_8_ =
         local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->field_0xb = 0x72745f726f746365;
    builtin_strncpy((char *)((long)&((pointer)(local_5d0._0_8_ + 0x10))->_vptr_Flag + 3),"ee_ledge",
                    8);
    ((pointer)local_5d0._0_8_)->_vptr_Flag = (_func_int **)0x65776f745f72696d;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->byte = 0x726f746365735f72;
    local_5d0._8_8_ =
         local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(char *)((long)&((pointer)local_5d0._0_8_)->_vptr_Flag +
             (long)local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                   super__Vector_impl_data._M_start) = '\0';
    ppWVar30 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar4,(key_type *)local_5d0);
    pWVar29 = RandomizerWorld::path(world,pWVar11,*ppWVar30);
    ppIVar44 = (pWVar29->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((pWVar29->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar44) {
      (pWVar29->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar44;
    }
    if ((pointer)local_5d0._0_8_ != pFVar43) {
      operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
    }
    if ((mapped_type)local_410._0_8_ != (mapped_type)local_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(local_400[7],
                               CONCAT16(local_400[6],CONCAT24(local_400._4_2_,local_400._0_4_))) + 1
                     );
    }
  }
  pFVar43 = (pointer)(local_5d0 + 0x10);
  if (options->_tree_cutting_glitch_in_logic == true) {
    local_5d0._0_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x10;
    local_410._0_8_ = (pointer)local_400;
    local_410._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
                    (size_type *)local_5d0,0);
    local_400._0_4_ = (undefined4)local_5d0._0_8_;
    local_400._4_2_ = SUB82(local_5d0._0_8_,4);
    local_400[6] = SUB81(local_5d0._0_8_,6);
    local_400[7] = SUB81(local_5d0._0_8_,7);
    ((pointer)local_410._0_8_)->m_type = 'm';
    ((pointer)local_410._0_8_)->field_0x1 = 'i';
    ((pointer)local_410._0_8_)->field_0x2 = 'r';
    ((pointer)local_410._0_8_)->field_0x3 = '_';
    ((pointer)local_410._0_8_)->field_0x4 = 't';
    ((pointer)local_410._0_8_)->field_0x5 = 'o';
    ((pointer)local_410._0_8_)->field_0x6 = 'w';
    ((pointer)local_410._0_8_)->field_0x7 = 'e';
    ((pointer)local_410._0_8_)->m_value = (json_value)0x726f746365735f72;
    local_410._8_8_ = local_5d0._0_8_;
    (&((pointer)local_410._0_8_)->m_type)[local_5d0._0_8_] = null;
    pmVar4 = &world->_nodes;
    ppWVar30 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar4,(key_type *)local_410);
    pWVar11 = *ppWVar30;
    local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x1b;
    local_5d0._0_8_ = pFVar43;
    local_5d0._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0,
                    (size_type *)&local_560,0);
    local_5d0._16_8_ =
         local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->field_0xb = 0x72745f726f746365;
    builtin_strncpy((char *)((long)&((pointer)(local_5d0._0_8_ + 0x10))->_vptr_Flag + 3),"ee_coast",
                    8);
    ((pointer)local_5d0._0_8_)->_vptr_Flag = (_func_int **)0x65776f745f72696d;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->byte = 0x726f746365735f72;
    local_5d0._8_8_ =
         local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(char *)((long)&((pointer)local_5d0._0_8_)->_vptr_Flag +
             (long)local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                   super__Vector_impl_data._M_start) = '\0';
    ppWVar30 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar4,(key_type *)local_5d0);
    pWVar29 = RandomizerWorld::path(world,pWVar11,*ppWVar30);
    ppIVar44 = (pWVar29->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((pWVar29->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar44) {
      (pWVar29->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar44;
    }
    if ((pointer)local_5d0._0_8_ != pFVar43) {
      operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
    }
    if ((pointer)local_410._0_8_ != (pointer)local_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(local_400[7],
                               CONCAT16(local_400[6],CONCAT24(local_400._4_2_,local_400._0_4_))) + 1
                     );
    }
    local_5d0._0_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x10;
    local_410._0_8_ = (pointer)local_400;
    local_410._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
                    (size_type *)local_5d0,0);
    local_400._0_4_ = (undefined4)local_5d0._0_8_;
    local_400._4_2_ = SUB82(local_5d0._0_8_,4);
    local_400[6] = SUB81(local_5d0._0_8_,6);
    local_400[7] = SUB81(local_5d0._0_8_,7);
    ((mapped_type)local_410._0_8_)->_vptr_Item = (_func_int **)0x65776f745f72696d;
    ((mapped_type)local_410._0_8_)->_id = 'r';
    ((mapped_type)local_410._0_8_)->field_0x9 = '_';
    ((mapped_type)local_410._0_8_)->field_0xa = 's';
    ((mapped_type)local_410._0_8_)->field_0xb = 'e';
    ((mapped_type)local_410._0_8_)->field_0xc = 'c';
    ((mapped_type)local_410._0_8_)->field_0xd = 't';
    ((mapped_type)local_410._0_8_)->field_0xe = 'o';
    ((mapped_type)local_410._0_8_)->field_0xf = 'r';
    local_410._8_8_ = local_5d0._0_8_;
    *(char *)((long)&((mapped_type)local_410._0_8_)->_vptr_Item + local_5d0._0_8_) = '\0';
    ppWVar30 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar4,(key_type *)local_410);
    pWVar11 = *ppWVar30;
    local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x1b;
    local_5d0._0_8_ = pFVar43;
    local_5d0._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0,
                    (size_type *)&local_560,0);
    local_5d0._16_8_ =
         local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->field_0xb = 0x72745f726f746365;
    builtin_strncpy((char *)((long)&((pointer)(local_5d0._0_8_ + 0x10))->_vptr_Flag + 3),"ee_ledge",
                    8);
    ((pointer)local_5d0._0_8_)->_vptr_Flag = (_func_int **)0x65776f745f72696d;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->byte = 0x726f746365735f72;
    local_5d0._8_8_ =
         local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(char *)((long)&((pointer)local_5d0._0_8_)->_vptr_Flag +
             (long)local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                   super__Vector_impl_data._M_start) = '\0';
    ppWVar30 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar4,(key_type *)local_5d0);
    pWVar29 = RandomizerWorld::path(world,pWVar11,*ppWVar30);
    ppIVar44 = (pWVar29->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((pWVar29->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar44) {
      (pWVar29->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar44;
    }
    if ((pointer)local_5d0._0_8_ != pFVar43) {
      operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
    }
    if ((mapped_type)local_410._0_8_ != (mapped_type)local_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(local_400[7],
                               CONCAT16(local_400[6],CONCAT24(local_400._4_2_,local_400._0_4_))) + 1
                     );
    }
  }
  if (options->_damage_boosting_in_logic == true) {
    ppWVar42 = (world->_paths).super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppWVar12 = (world->_paths).super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    if (ppWVar42 != ppWVar12) {
      do {
        pWVar29 = *ppWVar42;
        ppIVar44 = (pWVar29->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppIVar13 = (pWVar29->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        local_410[0] = 6;
        ppIVar22 = std::
                   map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                   ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                         *)world,local_410);
        local_410._0_8_ = *ppIVar22;
        _Var31 = std::
                 __find_if<__gnu_cxx::__normal_iterator<Item**,std::vector<Item*,std::allocator<Item*>>>,__gnu_cxx::__ops::_Iter_equals_val<Item*const>>
                           (ppIVar44,ppIVar13,local_410);
        ppIVar14 = (pWVar29->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        if (_Var31._M_current != ppIVar14) {
          ppIVar2 = _Var31._M_current + 1;
          if (ppIVar2 != ppIVar14) {
            memmove(_Var31._M_current,ppIVar2,(long)ppIVar14 - (long)ppIVar2);
          }
          pppIVar3 = &(pWVar29->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppIVar3 = *pppIVar3 + -1;
        }
        ppIVar44 = (pWVar29->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppIVar13 = (pWVar29->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        local_410[0] = 5;
        ppIVar22 = std::
                   map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                   ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                         *)world,local_410);
        local_410._0_8_ = *ppIVar22;
        _Var31 = std::
                 __find_if<__gnu_cxx::__normal_iterator<Item**,std::vector<Item*,std::allocator<Item*>>>,__gnu_cxx::__ops::_Iter_equals_val<Item*const>>
                           (ppIVar44,ppIVar13,local_410);
        ppIVar14 = (pWVar29->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        if (_Var31._M_current != ppIVar14) {
          ppIVar2 = _Var31._M_current + 1;
          if (ppIVar2 != ppIVar14) {
            memmove(_Var31._M_current,ppIVar2,(long)ppIVar14 - (long)ppIVar2);
          }
          pppIVar3 = &(pWVar29->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppIVar3 = *pppIVar3 + -1;
        }
        ppWVar42 = ppWVar42 + 1;
      } while (ppWVar42 != ppWVar12);
    }
  }
  pFVar43 = (pointer)(local_5d0 + 0x10);
  if (options->_allow_whistle_usage_behind_trees == true) {
    pWVar29 = (WorldPath *)operator_new(0x60);
    local_5d0._0_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x16;
    local_410._0_8_ = (pointer)local_400;
    local_410._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
                    (size_type *)local_5d0,0);
    local_400._0_4_ = (undefined4)local_5d0._0_8_;
    local_400._4_2_ = SUB82(local_5d0._0_8_,4);
    local_400[6] = SUB81(local_5d0._0_8_,6);
    local_400[7] = SUB81(local_5d0._0_8_,7);
    ((pointer)local_410._0_8_)->m_type = 'g';
    ((pointer)local_410._0_8_)->field_0x1 = 'r';
    ((pointer)local_410._0_8_)->field_0x2 = 'e';
    ((pointer)local_410._0_8_)->field_0x3 = 'e';
    ((pointer)local_410._0_8_)->field_0x4 = 'n';
    ((pointer)local_410._0_8_)->field_0x5 = 'm';
    ((pointer)local_410._0_8_)->field_0x6 = 'a';
    ((pointer)local_410._0_8_)->field_0x7 = 'z';
    ((pointer)local_410._0_8_)->m_value = (json_value)0x775f74736f705f65;
    *(undefined8 *)((long)&((pointer)local_410._0_8_)->m_value + 6) = 0x656c74736968775f;
    local_410._8_8_ = local_5d0._0_8_;
    (&((pointer)local_410._0_8_)->m_type)[local_5d0._0_8_] = null;
    ppWVar30 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(&world->_nodes,(key_type *)local_410);
    pWVar11 = *ppWVar30;
    local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x15;
    local_5d0._0_8_ = pFVar43;
    local_5d0._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0,
                    (size_type *)&local_560,0);
    local_5d0._16_8_ =
         local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    ((pointer)local_5d0._0_8_)->_vptr_Flag = (_func_int **)0x7a616d6e65657267;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->byte = 0x68775f6572705f65;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->field_0xd = 0x656c74736968775f;
    local_5d0._8_8_ =
         local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(char *)((long)&((pointer)local_5d0._0_8_)->_vptr_Flag +
             (long)local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                   super__Vector_impl_data._M_start) = '\0';
    ppWVar30 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(&world->_nodes,(key_type *)local_5d0);
    to_node = *ppWVar30;
    local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT71(local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,0x20);
    ppIVar22 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,(key_type_conflict *)&local_560);
    local_4a8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*ppIVar22;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_4a8;
    std::vector<Item_*,_std::allocator<Item_*>_>::vector
              (&local_560,__l_00,(allocator_type *)&local_4c8);
    local_448.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_448.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_448.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_468.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_468.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_468.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    WorldPath::WorldPath(pWVar29,pWVar11,to_node,1,&local_560,&local_448,&local_468);
    RandomizerWorld::add_path(world,pWVar29);
    if (local_468.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_468.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_468.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_468.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_448.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_448.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_448.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_448.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         *)local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
           super__Vector_impl_data._M_start !=
        (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         *)0x0) {
      operator_delete(local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pointer)local_5d0._0_8_ != pFVar43) {
      operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
    }
    if ((pointer)local_410._0_8_ != (pointer)local_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(local_400[7],
                               CONCAT16(local_400[6],CONCAT24(local_400._4_2_,local_400._0_4_))) + 1
                     );
    }
  }
  local_400._0_4_ = 0x676e696b;
  local_400._4_2_ = 0x6e5f;
  local_400[6] = 'o';
  local_400[7] = 'l';
  local_400._8_2_ = 0x5f65;
  local_400[10] = 99;
  local_400[0xb] = 0x61;
  local_400[0xc] = 0x76;
  local_400[0xd] = 0x65;
  local_410._8_8_ =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *)0xe;
  local_400[0xe] = 0;
  local_5d0._8_8_ =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *)0x6;
  local_5d0._16_7_ = 0x746c617a616b;
  local_5d0._0_8_ = pFVar43;
  local_410._0_8_ = (mapped_type)local_400;
  pWVar29 = RandomizerWorld::path(world,(string *)local_410,(string *)local_5d0);
  if ((pointer)local_5d0._0_8_ != pFVar43) {
    operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
  }
  if ((mapped_type)local_410._0_8_ != (mapped_type)local_400) {
    operator_delete((void *)local_410._0_8_,
                    CONCAT17(local_400[7],
                             CONCAT16(local_400[6],CONCAT24(local_400._4_2_,local_400._0_4_))) + 1);
  }
  if (options->_jewel_count < 6) {
    if (options->_jewel_count != 0) {
      local_410[0] = 0x28;
      ppIVar22 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      local_410._0_8_ = *ppIVar22;
      this = &pWVar29->_required_items;
      std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                ((vector<Item*,std::allocator<Item*>> *)this,(Item **)local_410);
      if (1 < options->_jewel_count) {
        local_410[0] = 0x2a;
        ppIVar22 = std::
                   map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                   ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                         *)world,local_410);
        local_410._0_8_ = *ppIVar22;
        std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                  ((vector<Item*,std::allocator<Item*>> *)this,(Item **)local_410);
      }
      if (2 < options->_jewel_count) {
        local_410[0] = 0x34;
        ppIVar22 = std::
                   map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                   ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                         *)world,local_410);
        local_410._0_8_ = *ppIVar22;
        std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                  ((vector<Item*,std::allocator<Item*>> *)this,(Item **)local_410);
      }
      if (3 < options->_jewel_count) {
        local_410[0] = 0x21;
        ppIVar22 = std::
                   map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                   ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                         *)world,local_410);
        local_410._0_8_ = *ppIVar22;
        std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                  ((vector<Item*,std::allocator<Item*>> *)this,(Item **)local_410);
      }
      if (4 < options->_jewel_count) {
        local_410[0] = 0x22;
        ppIVar22 = std::
                   map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                   ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                         *)world,local_410);
        local_410._0_8_ = *ppIVar22;
        std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                  ((vector<Item*,std::allocator<Item*>> *)this,(Item **)local_410);
      }
    }
  }
  else {
    uVar37 = 0;
    do {
      local_410[0] = 0x28;
      ppIVar22 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      local_410._0_8_ = *ppIVar22;
      std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                ((vector<Item*,std::allocator<Item*>> *)&pWVar29->_required_items,(Item **)local_410
                );
      uVar37 = uVar37 + 1;
    } while (uVar37 < options->_jewel_count);
  }
  RandomizerOptions::goal_abi_cxx11_((string *)local_410,options);
  iVar17 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                     ((string *)local_410,"reach_kazalt");
  if ((mapped_type)local_410._0_8_ != (mapped_type)local_400) {
    operator_delete((void *)local_410._0_8_,
                    CONCAT17(local_400[7],
                             CONCAT16(local_400[6],CONCAT24(local_400._4_2_,local_400._0_4_))) + 1);
  }
  if (iVar17 == 0) {
    local_400._0_4_ = 0x646e65;
    local_410._8_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x3;
    pmVar4 = &world->_nodes;
    local_410._0_8_ = (mapped_type)local_400;
    ppWVar30 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar4,(key_type *)local_410);
    pWVar29->_to_node = *ppWVar30;
    if ((mapped_type)local_410._0_8_ != (mapped_type)local_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(local_400[7],
                               CONCAT16(local_400[6],CONCAT24(local_400._4_2_,local_400._0_4_))) + 1
                     );
    }
    pWVar29 = (WorldPath *)operator_new(0x60);
    local_400._0_4_ = 0x646e65;
    local_410._8_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x3;
    local_410._0_8_ = (mapped_type)local_400;
    ppWVar30 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar4,(key_type *)local_410);
    pWVar11 = *ppWVar30;
    local_5d0._0_8_ = local_5d0 + 0x10;
    local_5d0._8_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x6;
    local_5d0._16_7_ = 0x746c617a616b;
    ppWVar30 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar4,(key_type *)local_5d0);
    local_4a8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_4a8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_4a8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_4c8.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4c8.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4c8.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_488.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_488.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_488.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    WorldPath::WorldPath(pWVar29,pWVar11,*ppWVar30,1,&local_4a8,&local_4c8,&local_488);
    RandomizerWorld::add_path(world,pWVar29);
    if (local_488.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_488.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_488.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_488.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_4c8.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4c8.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_4c8.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4c8.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((mapped_type)
        local_4a8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_start != (mapped_type)0x0) {
      operator_delete(local_4a8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_4a8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_4a8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pointer)local_5d0._0_8_ != (pointer)(local_5d0 + 0x10)) {
      operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
    }
    if ((mapped_type)local_410._0_8_ != (mapped_type)local_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(local_400[7],
                               CONCAT16(local_400[6],CONCAT24(local_400._4_2_,local_400._0_4_))) + 1
                     );
    }
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::cbegin((const_iterator *)local_5d0,&options->_model_patch_spawns);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::iteration_proxy_value
            ((iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_410,(const_iterator *)local_5d0);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::cend((const_iterator *)local_5f8,&options->_model_patch_spawns);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::iteration_proxy_value
            ((iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_5d0,(const_iterator *)local_5f8);
  while (bVar15 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            ((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)local_410,(const_iterator *)local_5d0), !bVar15) {
    psVar18 = nlohmann::detail::
              iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::key((iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     *)local_410);
    pbVar19 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)local_410);
    cVar32 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>_>_>
             ::find(&(world->_available_spawn_locations)._M_t,psVar18);
    if ((_Rb_tree_header *)cVar32._M_node ==
        &(world->_available_spawn_locations)._M_t._M_impl.super__Rb_tree_header) {
      spawn = SpawnLocation::from_json(psVar18,pbVar19);
      RandomizerWorld::add_spawn_location(world,spawn);
    }
    else {
      ppSVar33 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>_>_>
                 ::at(&world->_available_spawn_locations,psVar18);
      SpawnLocation::apply_json(*ppSVar33,pbVar19);
    }
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_410);
    local_3f0._M_p = local_3f0._M_p + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_p != &local_3b0) {
    operator_delete(local_3c0._M_p,local_3b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0[0] != &local_3d0) {
    operator_delete(local_3e0[0],local_3d0._M_allocated_capacity + 1);
  }
  lVar21 = 0;
  do {
    (world->_item_quantities)._M_elems[lVar21] =
         (ushort)(options->_items_distribution)._M_elems[lVar21];
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x45);
  bVar16 = options->_jewel_count;
  if (bVar16 < 6) {
    if ((bVar16 != 0) && ((world->_item_quantities)._M_elems[0x28] == 0)) {
      (world->_item_quantities)._M_elems[0x28] = 1;
    }
    if ((1 < bVar16) && ((world->_item_quantities)._M_elems[0x2a] == 0)) {
      (world->_item_quantities)._M_elems[0x2a] = 1;
    }
    if ((2 < bVar16) && ((world->_item_quantities)._M_elems[0x34] == 0)) {
      (world->_item_quantities)._M_elems[0x34] = 1;
    }
    if ((3 < bVar16) && ((world->_item_quantities)._M_elems[0x21] == 0)) {
      (world->_item_quantities)._M_elems[0x21] = 1;
    }
    if ((bVar16 == 5) && ((world->_item_quantities)._M_elems[0x22] == 0)) {
      (world->_item_quantities)._M_elems[0x22] = 1;
    }
  }
  else if ((world->_item_quantities)._M_elems[0x28] < (ushort)bVar16) {
    (world->_item_quantities)._M_elems[0x28] = (ushort)bVar16;
    (world->_item_quantities)._M_elems[0x2a] = 0;
    (world->_item_quantities)._M_elems[0x34] = 0;
    (world->_item_quantities)._M_elems[0x21] = 0;
    (world->_item_quantities)._M_elems[0x22] = 0;
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::cbegin((const_iterator *)local_410,&options->_model_patch_hint_sources);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::cend((const_iterator *)local_5d0,&options->_model_patch_hint_sources);
  bVar15 = nlohmann::detail::
           iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::
           operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                     ((const_iterator *)local_410,(const_iterator *)local_5d0);
  if (!bVar15) {
    do {
      pbVar19 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)local_410);
      local_5f8._0_8_ = HintSource::from_json(pbVar19,&world->_nodes);
      std::vector<HintSource*,std::allocator<HintSource*>>::emplace_back<HintSource*&>
                ((vector<HintSource*,std::allocator<HintSource*>> *)&world->_hint_sources,
                 (HintSource **)local_5f8);
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)local_410);
      bVar15 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::
               operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                         ((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)local_410,
                          (iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)local_5d0);
    } while (!bVar15);
  }
  return;
}

Assistant:

void apply_randomizer_options(const RandomizerOptions& options, RandomizerWorld& world)
{
    world.starting_golds(options.starting_gold());
    world.starting_life(options.starting_life());

    patch_starting_flags(world, options);
    patch_items(world, options);
    patch_game_strings(world, options);

    apply_options_on_logic_paths(options, world);
    apply_options_on_spawn_locations(options, world);
    apply_options_on_item_distributions(options, world);
    apply_options_on_hint_sources(options, world);
}